

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
crossover(storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this,
         local_context *ctx,bit_array *x)

{
  normal_distribution<double> *this_00;
  int iVar1;
  char *pcVar2;
  pointer prVar3;
  uint indent;
  int index;
  bit_array_impl *this_01;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar4;
  result_type rVar5;
  string_view fmt;
  string_view fmt_00;
  double *in_stack_ffffffffffffffb8;
  int first;
  int first_1;
  int local_34;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  dVar4 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&ctx->rng);
  this_00 = &ctx->choose_sol_dist;
  if ((ctx->crossover_bastert_insertion)._M_param._M_p <= dVar4) {
    do {
      do {
        rVar5 = std::normal_distribution<double>::operator()(this_00,&ctx->rng,&this_00->_M_param);
      } while (rVar5 < 0.0);
    } while (1.0 < rVar5);
    first_1 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)(rVar5 * (double)this->m_size)];
    do {
      do {
        dVar4 = std::normal_distribution<double>::operator()(this_00,&ctx->rng,&this_00->_M_param);
      } while (dVar4 < 0.0);
    } while (1.0 < dVar4);
    while (local_34 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)(dVar4 * (double)this->m_size)],
          first_1 == local_34) {
      do {
        do {
          dVar4 = std::normal_distribution<double>::operator()(this_00,&ctx->rng,&this_00->_M_param)
          ;
        } while (dVar4 < 0.0);
      } while (1.0 < dVar4);
    }
    prVar3 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    crossover(this,ctx,x,&prVar3[first_1].x,&prVar3[local_34].x);
    prVar3 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fmt._M_str = (char *)&first_1;
    fmt._M_len = (size_t)"- crossover between {} ({}) and {} ({})\n";
    to_log<int,double,int,double>
              (_stdout,(FILE *)0x7,0x28,fmt,(int *)&prVar3[first_1].value,(double *)&local_34,
               (int *)&prVar3[local_34].value,in_stack_ffffffffffffffb8);
    goto LAB_001932cc;
  }
  do {
    do {
      rVar5 = std::normal_distribution<double>::operator()(this_00,&ctx->rng,&this_00->_M_param);
    } while (rVar5 < 0.0);
  } while (1.0 < rVar5);
  first = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)(rVar5 * (double)this->m_size)];
  dVar4 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&ctx->rng);
  if (0.5 <= dVar4) {
    this_01 = &(this->m_random).super_bit_array_impl;
    iVar1 = (x->super_bit_array_impl).m_size;
    if (iVar1 != 0) {
      index = 0;
      do {
        dVar4 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&ctx->rng);
        if (0.5 <= dVar4) {
          bit_array_impl::unset(this_01,index);
        }
        else {
          bit_array_impl::set(this_01,index);
        }
        index = index + 1;
      } while (iVar1 != index);
    }
    dVar4 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&ctx->rng);
    prVar3 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start + first;
    if (0.5 <= dVar4) goto LAB_001932c1;
    crossover(this,ctx,x,&prVar3->x,(bit_array *)this_01);
    pcVar2 = "- crossover between {} ({}) and random\n";
    indent = 0x27;
  }
  else {
    dVar4 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (&ctx->rng);
    if (0.5 <= dVar4) {
      this_01 = &(this->m_bastert).super_bit_array_impl;
      prVar3 = (this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start + first;
LAB_001932c1:
      bit_array_impl::operator=((bit_array_impl *)prVar3,this_01);
      goto LAB_001932cc;
    }
    crossover(this,ctx,x,
              &(this->m_data).
               super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
               ._M_impl.super__Vector_impl_data._M_start[first].x,&this->m_bastert);
    pcVar2 = "- crossover between {} ({}) and bastert\n";
    indent = 0x28;
  }
  fmt_00._M_str = (char *)&first;
  fmt_00._M_len = (size_t)pcVar2;
  to_log<int,double>(_stdout,(FILE *)0x7,indent,fmt_00,
                     (int *)&(this->m_data).
                             super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[first].value,
                     in_stack_ffffffffffffffb8);
LAB_001932cc:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return;
}

Assistant:

void crossover(local_context& ctx, bit_array& x)
    {
        m_indices_reader lock(m_indices_mutex);

        if (ctx.crossover_bastert_insertion(ctx.rng)) {
            int first = m_indices[choose_a_solution(ctx)];
            std::bernoulli_distribution b(0.5);

            if (b(ctx.rng)) {
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_bastert);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and bastert\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_bastert;
                }
            } else {
                init_with_random(m_random, ctx.rng, x.size(), 0.5);
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_random);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and random\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_random;
                }
            }
        } else {
            int first = m_indices[choose_a_solution(ctx)];
            int second = m_indices[choose_a_solution(ctx)];
            while (first == second)
                second = m_indices[choose_a_solution(ctx)];

            crossover(ctx, x, m_data[first].x, m_data[second].x);

            to_log(stdout,
                   7u,
                   "- crossover between {} ({}) and {} ({})\n",
                   first,
                   m_data[first].value,
                   second,
                   m_data[second].value);
        }
    }